

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O0

bool __thiscall
draco::KdTreeAttributesDecoder::TransformAttributeBackToSignedType<int>
          (KdTreeAttributesDecoder *this,PointAttribute *att,int num_processed_signed_components)

{
  uint uVar1;
  value_type vVar2;
  int iVar3;
  byte bVar4;
  undefined1 uVar5;
  uint uVar6;
  vector<int,_std::allocator<int>_> *this_00;
  size_t sVar7;
  reference pvVar8;
  reference pvVar9;
  int in_EDX;
  PointAttribute *in_RSI;
  long in_RDI;
  int c;
  AttributeValueIndex avi;
  vector<int,_std::allocator<int>_> signed_val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unsigned_val;
  PointAttribute *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff50;
  GeometryAttribute *this_01;
  int local_7c;
  uint local_74;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_70;
  undefined1 local_69 [49];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  int local_1c;
  PointAttribute *local_18;
  byte local_1;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  GeometryAttribute::num_components(&in_RSI->super_GeometryAttribute);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1c6402);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff50,CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)
             ,(allocator_type *)in_stack_ffffffffffffff40);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1c6428);
  bVar4 = GeometryAttribute::num_components(&local_18->super_GeometryAttribute);
  this_00 = (vector<int,_std::allocator<int>_> *)(ulong)bVar4;
  this_01 = (GeometryAttribute *)local_69;
  std::allocator<int>::allocator((allocator<int> *)0x1c644c);
  std::vector<int,_std::allocator<int>_>::vector
            (this_00,CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             (allocator_type *)in_stack_ffffffffffffff40);
  std::allocator<int>::~allocator((allocator<int> *)0x1c646c);
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_70,0);
  do {
    sVar7 = PointAttribute::size(local_18);
    local_74 = (uint)sVar7;
    uVar5 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator<
                      (&local_70,&local_74);
    if (!(bool)uVar5) {
      local_1 = 1;
LAB_001c667f:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff40);
      return (bool)(local_1 & 1);
    }
    in_stack_ffffffffffffff40 = local_18;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_38,0);
    GeometryAttribute::GetValue
              ((GeometryAttribute *)CONCAT17(uVar5,in_stack_ffffffffffffff48),
               (AttributeValueIndex)(uint)((ulong)this_00 >> 0x20),in_stack_ffffffffffffff40);
    local_7c = 0;
    while( true ) {
      bVar4 = GeometryAttribute::num_components(&local_18->super_GeometryAttribute);
      if ((int)(uint)bVar4 <= local_7c) break;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_38,(long)local_7c);
      uVar1 = *pvVar8;
      uVar6 = std::numeric_limits<int>::max();
      if (uVar6 < uVar1) {
        local_1 = 0;
        goto LAB_001c667f;
      }
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_38,(long)local_7c);
      vVar2 = *pvVar8;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),
                          (long)(local_1c + local_7c));
      iVar3 = *pvVar9;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_69 + 1),(long)local_7c);
      *pvVar9 = vVar2 + iVar3;
      local_7c = local_7c + 1;
    }
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(local_69 + 1),0);
    GeometryAttribute::SetAttributeValue
              (this_01,(AttributeValueIndex)(uint)((ulong)in_RDI >> 0x20),this_00);
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(&local_70);
  } while( true );
}

Assistant:

bool KdTreeAttributesDecoder::TransformAttributeBackToSignedType(
    PointAttribute *att, int num_processed_signed_components) {
  typedef typename std::make_unsigned<SignedDataTypeT>::type UnsignedType;
  std::vector<UnsignedType> unsigned_val(att->num_components());
  std::vector<SignedDataTypeT> signed_val(att->num_components());

  for (AttributeValueIndex avi(0); avi < static_cast<uint32_t>(att->size());
       ++avi) {
    att->GetValue(avi, &unsigned_val[0]);
    for (int c = 0; c < att->num_components(); ++c) {
      // Up-cast |unsigned_val| to int32_t to ensure we don't overflow it for
      // smaller data types. But first check that the up-casting does not cause
      // signed integer overflow.
      if (unsigned_val[c] > std::numeric_limits<int32_t>::max()) {
        return false;
      }
      signed_val[c] = static_cast<SignedDataTypeT>(
          static_cast<int32_t>(unsigned_val[c]) +
          min_signed_values_[num_processed_signed_components + c]);
    }
    att->SetAttributeValue(avi, &signed_val[0]);
  }
  return true;
}